

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O1

bool CompressScript(CScript *script,CompressedScript *out)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  CompressedScript *pCVar4;
  uint uVar5;
  CScript *pCVar6;
  long in_FS_OFFSET;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  CPubKey pubkey;
  CScriptID scriptID;
  CKeyID keyID;
  CPubKey local_99;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uVar1 = (script->super_CScriptBase)._size;
  uVar5 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar5 = uVar1;
  }
  if (uVar5 == 0x19) {
    pCVar6 = script;
    if (0x1c < uVar1) {
      pCVar6 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (((((pCVar6->super_CScriptBase)._union.direct[0] != 'v') ||
         ((pCVar6->super_CScriptBase)._union.direct[1] != -0x57)) ||
        ((pCVar6->super_CScriptBase)._union.direct[2] != '\x14')) ||
       (((pCVar6->super_CScriptBase)._union.direct[0x17] != -0x78 ||
        ((pCVar6->super_CScriptBase)._union.direct[0x18] != -0x54)))) goto LAB_00d752f9;
    local_28 = *(undefined4 *)((long)&(pCVar6->super_CScriptBase)._union + 0x13);
    local_38 = *(undefined8 *)((long)&(pCVar6->super_CScriptBase)._union + 3);
    uStack_30 = *(undefined8 *)((long)&(pCVar6->super_CScriptBase)._union + 0xb);
    prevector<33U,_unsigned_char,_unsigned_int,_int>::resize(out,0x15);
    pCVar4 = out;
    if (0x21 < out->_size) {
      pCVar4 = (CompressedScript *)(out->_union).indirect_contents.indirect;
    }
    (pCVar4->_union).direct[0] = '\0';
    if (0x21 < out->_size) {
      out = (CompressedScript *)(out->_union).indirect_contents.indirect;
    }
    *(undefined4 *)((long)&out->_union + 0x11) = local_28;
    uVar7 = (undefined4)local_38;
    uVar8 = local_38._4_4_;
    uVar9 = (undefined4)uStack_30;
    uVar10 = uStack_30._4_4_;
LAB_00d75368:
    *(undefined4 *)((long)&out->_union + 1) = uVar7;
    *(undefined4 *)((long)&out->_union + 5) = uVar8;
    *(undefined4 *)((long)&(out->_union).indirect_contents.capacity + 1) = uVar9;
    *(undefined4 *)((long)&out->_union + 0xd) = uVar10;
LAB_00d75456:
    bVar2 = true;
  }
  else {
LAB_00d752f9:
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    if (uVar5 == 0x17) {
      pCVar6 = script;
      if (0x1c < uVar1) {
        pCVar6 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      if ((((pCVar6->super_CScriptBase)._union.direct[0] == -0x57) &&
          ((pCVar6->super_CScriptBase)._union.direct[1] == '\x14')) &&
         ((pCVar6->super_CScriptBase)._union.direct[0x16] == -0x79)) {
        local_48 = *(undefined4 *)((long)&(pCVar6->super_CScriptBase)._union + 0x12);
        local_58 = *(undefined8 *)((long)&(pCVar6->super_CScriptBase)._union + 2);
        uStack_50 = *(undefined8 *)((long)&(pCVar6->super_CScriptBase)._union + 10);
        prevector<33U,_unsigned_char,_unsigned_int,_int>::resize(out,0x15);
        pCVar4 = out;
        if (0x21 < out->_size) {
          pCVar4 = (CompressedScript *)(out->_union).indirect_contents.indirect;
        }
        (pCVar4->_union).direct[0] = '\x01';
        if (0x21 < out->_size) {
          out = (CompressedScript *)(out->_union).indirect_contents.indirect;
        }
        *(undefined4 *)((long)&out->_union + 0x11) = local_48;
        uVar7 = (undefined4)local_58;
        uVar8 = local_58._4_4_;
        uVar9 = (undefined4)uStack_50;
        uVar10 = uStack_50._4_4_;
        goto LAB_00d75368;
      }
    }
    local_99.vch[0] = 0xff;
    if (uVar5 == 0x43) {
      if (0x1c < uVar1) {
        script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      if ((((script->super_CScriptBase)._union.direct[0] == 'A') &&
          (script[2].super_CScriptBase._union.direct[2] == -0x54)) &&
         ((script->super_CScriptBase)._union.direct[1] == '\x04')) {
        CPubKey::Set<unsigned_char_const*>
                  (&local_99,(uchar *)((script->super_CScriptBase)._union.direct + 1),
                   (uchar *)(script[2].super_CScriptBase._union.direct + 2));
        bVar2 = CPubKey::IsFullyValid(&local_99);
        if (bVar2) goto LAB_00d75404;
      }
    }
    else if (uVar5 == 0x23) {
      if (0x1c < uVar1) {
        script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      if ((((script->super_CScriptBase)._union.direct[0] == '!') &&
          (script[1].super_CScriptBase._union.direct[2] == -0x54)) &&
         (((script->super_CScriptBase)._union.direct[1] & 0xfeU) == 2)) {
        CPubKey::Set<unsigned_char_const*>
                  (&local_99,(uchar *)((script->super_CScriptBase)._union.direct + 1),
                   (uchar *)(script[1].super_CScriptBase._union.direct + 2));
LAB_00d75404:
        prevector<33U,_unsigned_char,_unsigned_int,_int>::resize(out,0x21);
        pCVar4 = out;
        if (0x21 < out->_size) {
          pCVar4 = (CompressedScript *)(out->_union).indirect_contents.indirect;
        }
        *(undefined8 *)((long)&pCVar4->_union + 0x11) = local_99.vch._17_8_;
        *(undefined8 *)((long)&pCVar4->_union + 0x19) = local_99.vch._25_8_;
        *(undefined8 *)((long)&(pCVar4->_union).indirect_contents.indirect + 1) = local_99.vch._1_8_
        ;
        *(undefined8 *)((long)&pCVar4->_union + 9) = local_99.vch._9_8_;
        bVar3 = local_99.vch[0];
        if (1 < local_99.vch[0] - 2) {
          if (local_99.vch[0] != 4) goto LAB_00d7545a;
          bVar3 = local_99.vch[0x40] & 1 | 4;
        }
        if (0x21 < out->_size) {
          out = (CompressedScript *)(out->_union).indirect_contents.indirect;
        }
        (out->_union).direct[0] = bVar3;
        goto LAB_00d75456;
      }
    }
LAB_00d7545a:
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CompressScript(const CScript& script, CompressedScript& out)
{
    CKeyID keyID;
    if (IsToKeyID(script, keyID)) {
        out.resize(21);
        out[0] = 0x00;
        memcpy(&out[1], &keyID, 20);
        return true;
    }
    CScriptID scriptID;
    if (IsToScriptID(script, scriptID)) {
        out.resize(21);
        out[0] = 0x01;
        memcpy(&out[1], &scriptID, 20);
        return true;
    }
    CPubKey pubkey;
    if (IsToPubKey(script, pubkey)) {
        out.resize(33);
        memcpy(&out[1], &pubkey[1], 32);
        if (pubkey[0] == 0x02 || pubkey[0] == 0x03) {
            out[0] = pubkey[0];
            return true;
        } else if (pubkey[0] == 0x04) {
            out[0] = 0x04 | (pubkey[64] & 0x01);
            return true;
        }
    }
    return false;
}